

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack14_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1 & 0x3fff;
  uVar2 = in[1];
  out[1] = uVar1 >> 0xe & 0x3fff;
  out[2] = uVar1 >> 0x1c;
  out[2] = uVar1 >> 0x1c | (uVar2 & 0x3ff) << 4;
  out[3] = uVar2 >> 10 & 0x3fff;
  out[4] = uVar2 >> 0x18;
  uVar1 = in[2];
  out[4] = uVar2 >> 0x18 | (uVar1 & 0x3f) << 8;
  out[5] = uVar1 >> 6 & 0x3fff;
  out[6] = uVar1 >> 0x14;
  uVar2 = in[3];
  out[6] = uVar1 >> 0x14 | (uVar2 & 3) << 0xc;
  out[7] = uVar2 >> 2 & 0x3fff;
  return in + 4;
}

Assistant:

const uint32_t *__fastunpack14_8(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 14);
  out++;
  *out = ((*in) >> 14) % (1U << 14);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 10)) << (14 - 10);
  out++;
  *out = ((*in) >> 10) % (1U << 14);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 6)) << (14 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 14);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 2)) << (14 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 14);
  out++;

  return in + 1;
}